

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O1

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* getPredefinedTransformations1L1Q1P<double>
            (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             *__return_storage_ptr__,Matrix<double,_4,_1,_0,_4,_1> *P1,
            Matrix<double,_4,_1,_0,_4,_1> *P1_B,Matrix<double,_4,_1,_0,_4,_1> *Pi,
            Matrix<double,_4,_1,_0,_4,_1> *Pi_B)

{
  double dVar1;
  double dVar2;
  iterator iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>> *this;
  PointerType ptr;
  undefined8 *puVar7;
  double *pdVar8;
  long lVar9;
  Matrix<double,_4,_1,_0,_4,_1> *pMVar10;
  _Nested n;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar11;
  iterator iVar12;
  assign_op<double,_double> *paVar13;
  SrcXprType *src;
  byte bVar14;
  Scalar SVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  RealScalar z_1;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  RealScalar z;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  RealScalar z_2;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Matrix<double,_3,_1,_0,_3,_1> v3;
  type tmp;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  *out;
  Matrix<double,_4,_4,_0,_4,_4> TP;
  Matrix<double,_4,_4,_0,_4,_4> transV_B;
  Matrix<double,_4,_4,_0,_4,_4> transV;
  Matrix<double,_4,_4,_0,_4,_4> TP_B;
  Matrix<double,_4,_1,_0,_4,_1> Pi_B1;
  Matrix<double,_4,_1,_0,_4,_1> Pi_1;
  Matrix<double,_4,_4,_0,_4,_4> transU_B;
  Matrix<double,_4,_4,_0,_4,_4> transU;
  undefined1 local_4a8 [16];
  double local_498;
  Matrix<double,_3,_1,_0,_3,_1> local_488;
  Matrix<double,_4,_4,_1,_4,_4> local_468;
  Matrix<double,_4,_1,_0,_4,_1> *local_3e8;
  Matrix<double,_4,_4,_1,_4,_4> *local_3e0;
  Matrix<double,_4,_1,_0,_4,_1> *local_3d8;
  undefined8 local_3d0;
  vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>> *local_3c8
  ;
  double local_3c0;
  Matrix<double,_4,_4,_0,_4,_4> local_3b8;
  undefined1 local_338 [16];
  Matrix<double,_4,_1,_0,_4,_1> local_328;
  double local_308;
  double dStack_300;
  double local_2f8;
  double dStack_2f0;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double dStack_2c0;
  undefined1 local_2b8 [16];
  Matrix<double,_4,_1,_0,_4,_1> local_2a8;
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  double local_268;
  double dStack_260;
  double local_258;
  double dStack_250;
  double local_248;
  double dStack_240;
  double local_238;
  double dStack_230;
  double local_228;
  double local_218;
  undefined8 uStack_210;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  Matrix<double,_4,_4,_0,_4,_4> local_1f8;
  Matrix<double,_4,_1,_0,_4,_1> local_178;
  Matrix<double,_4,_1,_0,_4,_1> local_158;
  double local_138 [16];
  undefined1 local_b8 [16];
  double local_a8;
  Matrix<double,_4,_1,_0,_4,_1> *apMStack_a0 [9];
  undefined1 local_58 [16];
  double local_48;
  undefined8 uStack_40;
  
  bVar14 = 0;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[4] =
       0.0;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[6] =
       1.97626258336499e-323;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[8] =
       1.48219693752374e-323;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xb]
       = 0.0;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xd]
       = 1.97626258336499e-323;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0] =
       (double)P1;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3] =
       (double)P1;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[7] =
       (double)Pi;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[10]
       = (double)Pi;
  local_3c8 = (vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
               *)__return_storage_ptr__;
  local_b8._8_8_ = P1;
  apMStack_a0[0] = Pi;
  SVar15 = Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>const,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                       *)local_b8,(scalar_sum_op<double,_double> *)local_138,
                      (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                       *)&local_468);
  local_228 = SVar15 + (Pi->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
                       m_data.array[3];
  local_208 = *(undefined4 *)
               (P1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
               array;
  uStack_204 = *(undefined4 *)
                ((long)(P1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
                       m_data.array + 4);
  uStack_200 = *(undefined4 *)
                ((P1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data
                 .array + 1);
  uStack_1fc = *(undefined4 *)
                ((long)(P1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
                       m_data.array + 0xc);
  local_238 = (Pi->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[0];
  dStack_230 = (Pi->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
               array[1];
  local_3c0 = (Pi->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[2] * local_228;
  local_218 = (P1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[2];
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[4] =
       0.0;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[6] =
       1.97626258336499e-323;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[8] =
       1.48219693752374e-323;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xb]
       = 0.0;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xd]
       = 1.97626258336499e-323;
  uStack_210 = 0;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0] =
       (double)P1_B;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3] =
       (double)P1_B;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[7] =
       (double)Pi_B;
  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[10]
       = (double)Pi_B;
  local_b8._8_8_ = P1_B;
  apMStack_a0[0] = Pi_B;
  SVar15 = Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>const,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                       *)local_b8,(scalar_sum_op<double,_double> *)local_138,
                      (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                       *)&local_468);
  dVar19 = (double)CONCAT44(uStack_1fc,uStack_200) - dStack_230 * local_228;
  dVar16 = SVar15 + (Pi_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
                    m_data.array[3];
  dVar20 = (P1_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
           array[0];
  dVar4 = (P1_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[1];
  dVar5 = (Pi_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[0];
  dVar6 = (Pi_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[1];
  dVar1 = (Pi_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[2];
  dVar2 = (P1_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[2];
  puVar7 = (undefined8 *)local_b8;
  local_b8._0_8_ = 0.0;
  local_b8._8_8_ = (PointerType)0x0;
  local_a8 = 0.0;
  apMStack_a0[0] = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  apMStack_a0[1] = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  apMStack_a0[2] = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  apMStack_a0[3] = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  apMStack_a0[4] = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  apMStack_a0[5] = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  apMStack_a0[6] = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  apMStack_a0[7] = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  apMStack_a0[8] = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  uStack_40 = 0;
  lVar9 = 0;
  do {
    *puVar7 = 0x3ff0000000000000;
    lVar9 = lVar9 + 0x20;
    puVar7 = puVar7 + 5;
  } while (lVar9 != 0x80);
  local_58._8_4_ = SUB84(dVar19,0);
  local_58._0_8_ = -((double)CONCAT44(uStack_204,local_208) - local_238 * local_228);
  local_58._12_4_ = (uint)((ulong)dVar19 >> 0x20) ^ 0x80000000;
  local_48 = -(local_218 - local_3c0);
  pdVar8 = local_138;
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  local_138[3] = 0.0;
  local_138[4] = 0.0;
  local_138[5] = 0.0;
  local_138[6] = 0.0;
  local_138[7] = 0.0;
  local_138[8] = 0.0;
  local_138[9] = 0.0;
  local_138[10] = 0.0;
  local_138[0xb] = 0.0;
  local_138[0xf] = 0.0;
  lVar9 = 0;
  do {
    *pdVar8 = 1.0;
    lVar9 = lVar9 + 0x20;
    pdVar8 = pdVar8 + 5;
  } while (lVar9 != 0x80);
  local_138[0xc] = -(dVar20 - dVar5 * dVar16);
  local_138[0xd] = -(dVar4 - dVar6 * dVar16);
  local_138[0xe] = -(dVar2 - dVar16 * dVar1);
  local_2b8._0_8_ = local_b8;
  local_2b8._8_8_ = Pi;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&local_468,(SrcXprType *)local_2b8,(assign_op<double,_double> *)local_338);
  local_3e8 = (Matrix<double,_4,_1,_0,_4,_1> *)local_2b8._8_8_;
  local_3d8 = (Matrix<double,_4,_1,_0,_4,_1> *)local_2b8._8_8_;
  local_3d0 = 4;
  if ((local_2b8._8_8_ & 0xf) == 0) {
    dVar1 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_2b8._8_8_)->m_storage)
            .m_data.array[0];
    dVar2 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_2b8._8_8_)->m_storage)
            .m_data.array[1];
    dVar19 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_2b8._8_8_)->m_storage
             ).m_data.array[2];
    dVar20 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_2b8._8_8_)->m_storage
             ).m_data.array[3];
    local_158.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[2] * dVar19 +
           local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[0] * dVar1 +
           local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[3] * dVar20 +
           local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[1] * dVar2;
    local_158.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[6] * dVar19 +
           local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[4] * dVar1 +
           local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[7] * dVar20 +
           local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[5] * dVar2;
    local_158.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[10] * dVar19 +
           local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[8] * dVar1 +
           local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[0xb] * dVar20 +
           local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[9] * dVar2;
    local_158.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = dVar19 * local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[0xe] +
           dVar1 * local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[0xc] +
           dVar20 * local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[0xf] +
           dVar2 * local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[0xd];
    local_2b8._0_8_ = local_138;
    src = (SrcXprType *)local_2b8;
    paVar13 = (assign_op<double,_double> *)local_338;
    local_3e0 = &local_468;
    local_2b8._8_8_ = Pi_B;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_468,src,paVar13);
    local_3e8 = (Matrix<double,_4,_1,_0,_4,_1> *)local_2b8._8_8_;
    local_3d8 = (Matrix<double,_4,_1,_0,_4,_1> *)local_2b8._8_8_;
    local_3d0 = 4;
    if ((local_2b8._8_8_ & 0xf) == 0) {
      dVar1 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_2b8._8_8_)->
              m_storage).m_data.array[0];
      dVar2 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_2b8._8_8_)->
              m_storage).m_data.array[1];
      dVar19 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_2b8._8_8_)->
               m_storage).m_data.array[2];
      dVar20 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_2b8._8_8_)->
               m_storage).m_data.array[3];
      local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [0] = local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[2] * dVar19 +
            local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[0] * dVar1 +
            local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[3] * dVar20 +
            local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[1] * dVar2;
      local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [1] = local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[6] * dVar19 +
            local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[4] * dVar1 +
            local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[7] * dVar20 +
            local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[5] * dVar2;
      local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [2] = local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[10] * dVar19 +
            local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[8] * dVar1 +
            local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[0xb] * dVar20 +
            local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[9] * dVar2;
      local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [3] = dVar19 * local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[0xe] +
            dVar1 * local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[0xc] +
            dVar20 * local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[0xf] +
            dVar2 * local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[0xd];
      local_2b8._0_8_ = (non_const_type)0x0;
      local_2b8._8_8_ = 0.0;
      local_2a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [0] = 0.0;
      local_2a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [1] = 0.0;
      local_2a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [2] = 0.0;
      local_2a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [3] = 0.0;
      local_288 = 0.0;
      dStack_280 = 0.0;
      local_278 = 0.0;
      dStack_270 = 0.0;
      local_268 = 0.0;
      dStack_260 = 0.0;
      local_258 = 0.0;
      dStack_250 = 0.0;
      local_248 = 0.0;
      dStack_240 = 0.0;
      lVar9 = 0;
      do {
        (src->m_xpr).m_matrix = (non_const_type)0x3ff0000000000000;
        lVar9 = lVar9 + 0x20;
        src = src + 5;
      } while (lVar9 != 0x80);
      local_2c8 = 0.0;
      dStack_2c0 = 0.0;
      local_2d8 = 0.0;
      dStack_2d0 = 0.0;
      local_2e8 = 0.0;
      dStack_2e0 = 0.0;
      local_2f8 = 0.0;
      dStack_2f0 = 0.0;
      local_308 = 0.0;
      dStack_300 = 0.0;
      local_328.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [2] = 0.0;
      local_328.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [3] = 0.0;
      local_328.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [0] = 0.0;
      local_328.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [1] = 0.0;
      local_338._0_8_ = 0.0;
      local_338._8_8_ = 0.0;
      lVar9 = 0;
      do {
        *(undefined8 *)paVar13 = 0x3ff0000000000000;
        lVar9 = lVar9 + 0x20;
        paVar13 = paVar13 + 0x28;
      } while (lVar9 != 0x80);
      local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [0] = (double)(&local_178 + 1);
      local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [1] = 1.48219693752374e-323;
      local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [4] = 0.0;
      local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [6] = 1.97626258336499e-323;
      local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [3] = local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[0];
      local_3e0 = &local_468;
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::
      normalized((PlainObject *)&local_3b8,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                 &local_468);
      if (local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[4] == 1.48219693752374e-323) {
        local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0];
        local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[1];
        local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[2];
        local_4a8._0_8_ =
             local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array[2] * 0.0 +
             local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array[1] * -0.0;
        dVar1 = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[1] * 0.0 -
                local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0];
        dVar19 = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0] * 0.0;
        auVar28._0_8_ =
             dVar19 - local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[2];
        auVar28._8_8_ = 0;
        dVar2 = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[1] - dVar19;
        local_4a8._8_8_ = auVar28._0_8_;
        auVar17._0_8_ =
             local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array[1] * -0.0 +
             local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array[2];
        dVar19 = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[2] * -0.0 + dVar19;
        auVar17._8_8_ = dVar19;
        dVar20 = dVar2 * dVar2 +
                 auVar28._0_8_ * auVar28._0_8_ + (double)local_4a8._0_8_ * (double)local_4a8._0_8_;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar20;
        auVar23 = sqrtpd(auVar28,auVar23);
        dVar19 = dVar1 * dVar1 + dVar19 * dVar19 + auVar17._0_8_ * auVar17._0_8_;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = dVar19;
        auVar28 = sqrtpd(auVar27,auVar27);
        auVar24._0_8_ = auVar23._0_8_;
        auVar29._0_8_ = auVar28._0_8_;
        if (auVar29._0_8_ <= auVar24._0_8_) {
          if (0.0 < dVar20) {
            auVar24._8_8_ = auVar24._0_8_;
            local_4a8 = divpd(local_4a8,auVar24);
          }
          local_498 = (double)(~-(ulong)(0.0 < dVar20) & (ulong)dVar2 |
                              (ulong)(dVar2 / auVar24._0_8_) & -(ulong)(0.0 < dVar20));
        }
        else {
          if (0.0 < dVar19) {
            auVar29._8_8_ = auVar29._0_8_;
            auVar17 = divpd(auVar17,auVar29);
          }
          local_498 = (double)(~-(ulong)(0.0 < dVar19) & (ulong)dVar1 |
                              (ulong)(dVar1 / auVar29._0_8_) & -(ulong)(0.0 < dVar19));
          local_4a8 = auVar17;
        }
        local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[1] = 4.94065645841247e-324;
        local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[2] = 1.48219693752374e-323;
        local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[4] = 0.0;
        local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[5] = 0.0;
        local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[6] = 1.97626258336499e-323;
        local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[0] = (double)local_2b8;
        local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[3] = (double)local_2b8;
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0] = (double)local_4a8;
        Eigen::internal::
        check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                  ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&local_468,
                   (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_3b8);
        if ((local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[1] == 4.94065645841247e-324) &&
           (local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[2] == 1.48219693752374e-323)) {
          lVar9 = 0;
          do {
            (((Matrix<double,_4,_1,_0,_4,_1> *)
             local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[0])->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
            m_data.array[0] =
                 (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                  local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0])->m_storage).m_data.array[lVar9];
            lVar9 = lVar9 + 1;
            local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[0] = (double)((long)local_468.
                                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                                      m_storage.m_data.array[0] + 0x20);
          } while (lVar9 != 3);
          local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0] = local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1] * local_498 -
                     (double)local_4a8._8_8_ *
                     local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2];
          local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[1] = local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2] * (double)local_4a8._0_8_ -
                     local_498 *
                     local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
          local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[2] = local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0] * (double)local_4a8._8_8_ -
                     (double)local_4a8._0_8_ *
                     local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1];
          local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[0] = (double)(local_2b8 + 8);
          local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[1] = 4.94065645841247e-324;
          local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[2] = 1.48219693752374e-323;
          local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[4] = 4.94065645841247e-324;
          local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[5] = 0.0;
          local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[6] = 1.97626258336499e-323;
          local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[3] = (double)local_2b8;
          local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0] = (double)&local_3b8;
          Eigen::internal::
          check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                    ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&local_468,
                     (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_1f8);
          if ((local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
               m_data.array[1] == 4.94065645841247e-324) &&
             (local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[2] == 1.48219693752374e-323)) {
            lVar9 = 0;
            do {
              (((Matrix<double,_4,_1,_0,_4,_1> *)
               local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
               m_data.array[0])->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
              m_storage.m_data.array[0] =
                   (double)(((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                            local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                            m_storage.m_data.array[0])->m_storage).m_data.array[lVar9];
              lVar9 = lVar9 + 1;
              local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[0] =
                   (double)((long)local_468.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                                  m_storage.m_data.array[0] + 0x20);
            } while (lVar9 != 3);
            local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[0] = (double)&local_2a8;
            local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[1] = 4.94065645841247e-324;
            local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[2] = 1.48219693752374e-323;
            local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[4] = 9.88131291682493e-324;
            local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[5] = 0.0;
            local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[6] = 1.97626258336499e-323;
            local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[3] = (double)local_2b8;
            local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0] = (double)&local_488;
            Eigen::internal::
            check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                      ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&local_468,
                       (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_3b8);
            if ((local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[1] == 4.94065645841247e-324) &&
               (local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[2] == 1.48219693752374e-323)) {
              lVar9 = 0;
              do {
                (((Matrix<double,_4,_1,_0,_4,_1> *)
                 local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[0])->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
                m_storage.m_data.array[0] =
                     (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                      local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0])->m_storage).m_data.array[lVar9];
                lVar9 = lVar9 + 1;
                local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[0] =
                     (double)((long)local_468.
                                    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                                    m_storage.m_data.array[0] + 0x20);
              } while (lVar9 != 3);
              local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[0] = (double)&local_178;
              local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[1] = 1.48219693752374e-323;
              local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[4] = 0.0;
              local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[6] = 1.97626258336499e-323;
              local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[3] =
                   local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[0];
              Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::
              normalized((PlainObject *)&local_3b8,
                         (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                          *)&local_468);
              if (local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[4] != 1.48219693752374e-323) goto LAB_00150652;
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] =
                   local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0];
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1] =
                   local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[1];
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[2] =
                   local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[2];
              local_4a8._0_8_ =
                   local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[2] * 0.0 +
                   local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[1] * -0.0;
              dVar1 = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[1] * 0.0 -
                      local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0];
              dVar19 = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0] * 0.0;
              local_4a8._8_8_ =
                   dVar19 - local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                            m_storage.m_data.array[2];
              dVar2 = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[1] - dVar19;
              auVar18._0_8_ =
                   local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[1] * -0.0 +
                   local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[2];
              dVar19 = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[2] * -0.0 + dVar19;
              auVar18._8_8_ = dVar19;
              dVar20 = dVar2 * dVar2 +
                       (double)local_4a8._8_8_ * (double)local_4a8._8_8_ +
                       (double)local_4a8._0_8_ * (double)local_4a8._0_8_;
              auVar21._8_8_ = 0;
              auVar21._0_8_ = dVar20;
              auVar17 = sqrtpd(auVar21,auVar21);
              dVar19 = dVar1 * dVar1 + dVar19 * dVar19 + auVar18._0_8_ * auVar18._0_8_;
              auVar25._8_8_ = 0;
              auVar25._0_8_ = dVar19;
              auVar23 = sqrtpd(auVar25,auVar25);
              auVar22._0_8_ = auVar17._0_8_;
              auVar26._0_8_ = auVar23._0_8_;
              if (auVar26._0_8_ <= auVar22._0_8_) {
                local_498 = (double)(~-(ulong)(0.0 < dVar20) & (ulong)dVar2 |
                                    (ulong)(dVar2 / auVar22._0_8_) & -(ulong)(0.0 < dVar20));
                auVar18 = local_4a8;
                if (0.0 < dVar20) {
                  auVar22._8_8_ = auVar22._0_8_;
                  auVar18 = divpd(local_4a8,auVar22);
                }
              }
              else {
                local_498 = (double)(~-(ulong)(0.0 < dVar19) & (ulong)dVar1 |
                                    (ulong)(dVar1 / auVar26._0_8_) & -(ulong)(0.0 < dVar19));
                if (0.0 < dVar19) {
                  auVar26._8_8_ = auVar26._0_8_;
                  auVar18 = divpd(auVar18,auVar26);
                }
              }
              local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[1] = 4.94065645841247e-324;
              local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[2] = 1.48219693752374e-323;
              local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[4] = 0.0;
              local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[5] = 0.0;
              local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[6] = 1.97626258336499e-323;
              local_4a8 = auVar18;
              local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[0] = (double)local_338;
              local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[3] = (double)local_338;
              local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0] = (double)local_4a8;
              Eigen::internal::
              check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                        ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&local_468,
                         (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_3b8);
              if ((local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[1] == 4.94065645841247e-324) &&
                 (local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[2] == 1.48219693752374e-323)) {
                lVar9 = 0;
                do {
                  (((Matrix<double,_4,_1,_0,_4,_1> *)
                   local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[0])->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
                  m_storage.m_data.array[0] =
                       (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0])->m_storage).m_data.array[lVar9];
                  lVar9 = lVar9 + 1;
                  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[0] =
                       (double)((long)local_468.
                                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                                      m_storage.m_data.array[0] + 0x20);
                } while (lVar9 != 3);
                local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0] =
                     local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1] * local_498 -
                     (double)local_4a8._8_8_ *
                     local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2];
                local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[1] =
                     local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2] * (double)local_4a8._0_8_ -
                     local_498 *
                     local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
                local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[2] =
                     local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0] * (double)local_4a8._8_8_ -
                     (double)local_4a8._0_8_ *
                     local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1];
                local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[0] = (double)(local_338 + 8);
                local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[1] = 4.94065645841247e-324;
                local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[2] = 1.48219693752374e-323;
                local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[4] = 4.94065645841247e-324;
                local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[5] = 0.0;
                local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[6] = 1.97626258336499e-323;
                local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[3] = (double)local_338;
                local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0] = (double)&local_3b8;
                Eigen::internal::
                check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                          ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&local_468,
                           (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_1f8);
                if ((local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[1] == 4.94065645841247e-324) &&
                   (local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[2] == 1.48219693752374e-323)) {
                  lVar9 = 0;
                  do {
                    (((Matrix<double,_4,_1,_0,_4,_1> *)
                     local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[0])->
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
                    array[0] = (double)(((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                                        local_1f8.
                                        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
                                        .m_storage.m_data.array[0])->m_storage).m_data.array[lVar9];
                    lVar9 = lVar9 + 1;
                    local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[0] =
                         (double)((long)local_468.
                                        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                                        .m_storage.m_data.array[0] + 0x20);
                  } while (lVar9 != 3);
                  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[0] = (double)&local_328;
                  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[1] = 4.94065645841247e-324;
                  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[2] = 1.48219693752374e-323;
                  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[4] = 9.88131291682493e-324;
                  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[5] = 0.0;
                  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[6] = 1.97626258336499e-323;
                  local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[3] = (double)local_338;
                  local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0] = (double)&local_488;
                  Eigen::internal::
                  check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)
                             &local_468,
                             (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_3b8);
                  this = local_3c8;
                  if ((local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[1] == 4.94065645841247e-324) &&
                     (local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                      m_storage.m_data.array[2] == 1.48219693752374e-323)) {
                    lVar9 = 0;
                    pMVar10 = (Matrix<double,_4,_1,_0,_4,_1> *)
                              local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                              .m_storage.m_data.array[0];
                    do {
                      (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
                      m_storage.m_data.array[0] =
                           (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                            m_storage.m_data.array[0])->m_storage).m_data.array[lVar9];
                      lVar9 = lVar9 + 1;
                      pMVar10 = pMVar10 + 1;
                    } while (lVar9 != 3);
                    *(undefined8 *)local_3c8 = 0;
                    *(undefined8 *)(local_3c8 + 8) = 0;
                    *(undefined8 *)(local_3c8 + 0x10) = 0;
                    lVar9 = 0;
                    do {
                      dVar1 = *(double *)(local_b8 + lVar9);
                      dVar2 = *(double *)(local_b8 + lVar9 + 8);
                      dVar19 = *(double *)(local_b8 + lVar9 + 0x10);
                      dVar20 = *(double *)(local_b8 + lVar9 + 0x18);
                      *(double *)
                       ((long)local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                              .m_storage.m_data.array + lVar9) =
                           local_258 * dVar20 +
                           local_278 * dVar19 +
                           local_2a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                           m_storage.m_data.array[2] * dVar2 + (double)local_2b8._0_8_ * dVar1;
                      *(double *)
                       ((long)local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                              .m_storage.m_data.array + lVar9 + 8) =
                           dStack_250 * dVar20 +
                           dStack_270 * dVar19 +
                           local_2a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                           m_storage.m_data.array[3] * dVar2 + (double)local_2b8._8_8_ * dVar1;
                      *(double *)
                       ((long)local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                              .m_storage.m_data.array + lVar9 + 0x10) =
                           dVar20 * local_248 +
                           dVar19 * local_268 +
                           dVar2 * local_288 +
                           dVar1 * local_2a8.
                                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                   m_storage.m_data.array[0];
                      *(double *)
                       ((long)local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                              .m_storage.m_data.array + lVar9 + 0x18) =
                           dVar20 * dStack_240 +
                           dVar19 * dStack_260 +
                           dVar2 * dStack_280 +
                           dVar1 * local_2a8.
                                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                   m_storage.m_data.array[1];
                      lVar9 = lVar9 + 0x20;
                    } while (lVar9 != 0x80);
                    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[0] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[0];
                    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[1] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[1];
                    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[2] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[2];
                    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[3] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[3];
                    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[4] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[4];
                    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[5] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[5];
                    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[6] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[6];
                    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[7] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[7];
                    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[8] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[8];
                    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[9] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[9];
                    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[10] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[10];
                    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[0xb] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[0xb];
                    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[0xc] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[0xc];
                    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[0xd] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[0xd];
                    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[0xe] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[0xe];
                    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[0xf] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[0xf];
                    iVar3._M_current = *(Matrix<double,_4,_4,_0,_4,_4> **)(local_3c8 + 8);
                    if (iVar3._M_current == *(Matrix<double,_4,_4,_0,_4,_4> **)(local_3c8 + 0x10)) {
                      std::
                      vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                      ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                                (local_3c8,iVar3,&local_3b8);
                    }
                    else {
                      pMVar11 = &local_3b8;
                      iVar12._M_current = iVar3._M_current;
                      for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
                        ((iVar12._M_current)->
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                        m_data.array[0] =
                             (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>)
                             .m_storage.m_data.array[0];
                        pMVar11 = (Matrix<double,_4,_4,_0,_4,_4> *)
                                  ((long)pMVar11 + ((ulong)bVar14 * -2 + 1) * 8);
                        iVar12._M_current =
                             (Matrix<double,_4,_4,_0,_4,_4> *)
                             ((long)iVar12._M_current + ((ulong)bVar14 * -2 + 1) * 8);
                      }
                      *(Matrix<double,_4,_4,_0,_4,_4> **)(local_3c8 + 8) = iVar3._M_current + 1;
                    }
                    lVar9 = 0;
                    do {
                      dVar1 = *(double *)((long)local_138 + lVar9);
                      dVar2 = *(double *)((long)local_138 + lVar9 + 8);
                      dVar19 = *(double *)((long)local_138 + lVar9 + 0x10);
                      dVar20 = *(double *)((long)local_138 + lVar9 + 0x18);
                      *(double *)
                       ((long)local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                              .m_storage.m_data.array + lVar9) =
                           local_2d8 * dVar20 +
                           local_2f8 * dVar19 +
                           local_328.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                           m_storage.m_data.array[2] * dVar2 + (double)local_338._0_8_ * dVar1;
                      *(double *)
                       ((long)local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                              .m_storage.m_data.array + lVar9 + 8) =
                           dStack_2d0 * dVar20 +
                           dStack_2f0 * dVar19 +
                           local_328.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                           m_storage.m_data.array[3] * dVar2 + (double)local_338._8_8_ * dVar1;
                      *(double *)
                       ((long)local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                              .m_storage.m_data.array + lVar9 + 0x10) =
                           dVar20 * local_2c8 +
                           dVar19 * local_2e8 +
                           dVar2 * local_308 +
                           dVar1 * local_328.
                                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                   m_storage.m_data.array[0];
                      *(double *)
                       ((long)local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                              .m_storage.m_data.array + lVar9 + 0x18) =
                           dVar20 * dStack_2c0 +
                           dVar19 * dStack_2e0 +
                           dVar2 * dStack_300 +
                           dVar1 * local_328.
                                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                   m_storage.m_data.array[1];
                      lVar9 = lVar9 + 0x20;
                    } while (lVar9 != 0x80);
                    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[0] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[0];
                    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[1] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[1];
                    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[2] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[2];
                    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[3] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[3];
                    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[4] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[4];
                    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[5] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[5];
                    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[6] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[6];
                    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[7] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[7];
                    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[8] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[8];
                    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[9] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[9];
                    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[10] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[10];
                    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[0xb] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[0xb];
                    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[0xc] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[0xc];
                    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[0xd] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[0xd];
                    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[0xe] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[0xe];
                    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[0xf] =
                         local_468.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[0xf];
                    iVar3._M_current = *(Matrix<double,_4,_4,_0,_4,_4> **)(this + 8);
                    if (iVar3._M_current == *(Matrix<double,_4,_4,_0,_4,_4> **)(this + 0x10)) {
                      std::
                      vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                      ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                                (this,iVar3,&local_1f8);
                    }
                    else {
                      pMVar11 = &local_1f8;
                      iVar12._M_current = iVar3._M_current;
                      for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
                        ((iVar12._M_current)->
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                        m_data.array[0] =
                             (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>)
                             .m_storage.m_data.array[0];
                        pMVar11 = (Matrix<double,_4,_4,_0,_4,_4> *)
                                  ((long)pMVar11 + ((ulong)bVar14 * -2 + 1) * 8);
                        iVar12._M_current =
                             (Matrix<double,_4,_4,_0,_4,_4> *)
                             ((long)iVar12._M_current + ((ulong)bVar14 * -2 + 1) * 8);
                      }
                      *(Matrix<double,_4,_4,_0,_4,_4> **)(this + 8) = iVar3._M_current + 1;
                    }
                    return (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                            *)this;
                  }
                }
              }
            }
          }
        }
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, 4, 4>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, 4, 4>>]"
                     );
      }
LAB_00150652:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 3, 1>]"
                   );
    }
  }
  local_3d0 = 4;
  local_3e8 = (Matrix<double,_4,_1,_0,_4,_1> *)local_2b8._8_8_;
  local_3e0 = &local_468;
  local_3d8 = (Matrix<double,_4,_1,_0,_4,_1> *)local_2b8._8_8_;
  __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                ,"/usr/include/eigen3/Eigen/src/Core/CoreEvaluators.h",0x4ca,
                "Eigen::internal::block_evaluator<const Eigen::Matrix<double, 4, 1>, 4, 1, true>::block_evaluator(const XprType &) [ArgType = const Eigen::Matrix<double, 4, 1>, BlockRows = 4, BlockCols = 1, InnerPanel = true, HasDirectAccess = true]"
               );
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations1L1Q1P(
	Matrix<floatPrec, 4,1> P1, Matrix<floatPrec, 4,1> P1_B,
	Matrix<floatPrec, 4,1> Pi, Matrix<floatPrec, 4,1> Pi_B)
{

	// project points P1 and P1_B to planes Pi and Pi_B
	Matrix<floatPrec, 4,1> P1_pi, P1_pi_B;
	P1_pi.head(3) = P1.head(3) - (P1.head(3).dot(Pi.head(3)) + Pi(3)) * Pi.head(3);
	P1_pi(3) = 1.0;
	P1_pi_B.head(3) = P1_B.head(3) - (P1_B.head(3).dot(Pi_B.head(3)) + Pi_B(3)) * Pi_B.head(3);
	P1_pi_B(3) = 1.0;

	// translate frames to P1_pi and P1_pi_B
	Matrix<floatPrec, 4,4> transU, transU_B;
	transU.setIdentity(4,4);
	transU.topRightCorner(3, 1) = -P1_pi.head(3);
	transU_B.setIdentity(4,4);
	transU_B.topRightCorner(3, 1) = -P1_pi_B.head(3);

	// transform P2 and P2_B to the new frame
	Matrix<floatPrec, 4,1> Pi_1, Pi_B1;
	Pi_1 = transU.transpose().inverse() * Pi;
	Pi_B1 = transU_B.transpose().inverse() * Pi_B;

	// aling planes Pi and Pi_B with XY planes of both frames
	Matrix<floatPrec, 4,4> transV, transV_B;
	transV.setIdentity(4,4);
	transV_B.setIdentity(4,4);

	// compute rotation ref A
	Matrix<floatPrec, 3,1> v3, v1, v1_, t1, t2;
	t1.setZero();
	t1(0) = 1;
	t2.setZero();
	t2(1) = 1;
	v3 = Pi_1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV.topLeftCorner(1, 3) = v1.transpose();
	transV.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV.block(2, 0, 1, 3) = v3.transpose();

	// compute rotation ref B
	v3 = Pi_B1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV_B.topLeftCorner(1, 3) = v1.transpose();
	transV_B.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV_B.block(2, 0, 1, 3) = v3.transpose();

	vector<Matrix<floatPrec, 4,4>> out;
	Matrix<floatPrec, 4,4> TP, TP_B;
	TP = transV * transU;
	out.push_back(TP);

	TP_B = transV_B * transU_B;
	out.push_back(TP_B);

	return out;
}